

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

void __thiscall foxxll::request::error_occured(request *this,char *msg)

{
  char *pcVar1;
  io_error *this_00;
  allocator local_39;
  string local_38;
  char *local_18;
  char *msg_local;
  request *this_local;
  
  local_18 = msg;
  msg_local = (char *)this;
  this_00 = (io_error *)operator_new(0x20);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  io_error::io_error(this_00,&local_38);
  std::unique_ptr<foxxll::io_error,_std::default_delete<foxxll::io_error>_>::reset
            (&this->error_,this_00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void request::error_occured(const char* msg)
{
    error_.reset(new io_error(msg));
}